

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_TestShell::createTest
          (TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_TestShell *this)

{
  Utest *this_00;
  TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x262);
  TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test::
  TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test
            ((TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, newCallStartsWhileNotAllParametersWerePassed)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1);
    mock().actualCall("foo");
    mock().actualCall("foo").withParameter("p1", 1);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}